

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  lys_node_list *node;
  lys_node_list *list;
  uint8_t *puVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  lys_module *module;
  LY_ERR *pLVar10;
  undefined8 uVar11;
  LY_ECODE code;
  size_t sVar12;
  lys_module *local_80;
  char *local_78;
  char *local_70;
  char *name;
  int local_5c;
  int local_58;
  int is_relative;
  int has_predicate;
  char *mod_name;
  char *pcStack_40;
  int nam_len;
  uint local_38;
  int local_34;
  int r;
  int mod_name_len;
  
  pcVar5 = ly_buf();
  local_5c = -1;
  if ((nodeid == (char *)0x0) || (ctx == (ly_ctx *)0x0 && start == (lys_node *)0x0)) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x7d4,
                  "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = start->module->ctx;
  }
  uVar3 = parse_schema_nodeid(nodeid,(char **)&has_predicate,&local_34,&local_70,
                              (int *)((long)&mod_name + 4),&local_5c,&local_58);
  local_38 = uVar3;
  if ((int)uVar3 < 1) {
    local_78 = nodeid + -uVar3;
    cVar1 = nodeid[-uVar3];
LAB_00115301:
    uVar3 = (uint)cVar1;
LAB_0011530d:
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar3,local_78);
    return (lys_node *)0x0;
  }
  if (local_5c == 0) {
    if (_has_predicate == (char *)0x0) {
      ly_vlog(LYE_PATH_MISSMOD,LY_VLOG_STR,nodeid);
      return (lys_node *)0x0;
    }
    if (0x3ff < local_34) {
      pLVar10 = ly_errno_location();
      *pLVar10 = LY_EINT;
      uVar11 = 0x7ef;
LAB_00115359:
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
             ,uVar11);
      return (lys_node *)0x0;
    }
    puVar6 = ly_buf_used_location();
    if ((*puVar6 == '\0') || (*pcVar5 == '\0')) {
      pcStack_40 = (char *)0x0;
    }
    else {
      pcStack_40 = strndup(pcVar5,0x3ff);
    }
    puVar6 = ly_buf_used_location();
    *puVar6 = *puVar6 + '\x01';
    sVar12 = (size_t)local_34;
    memmove(pcVar5,_has_predicate,sVar12);
    pcVar5[sVar12] = '\0';
    module = ly_ctx_get_module(ctx,pcVar5,(char *)0x0);
    pcVar2 = pcStack_40;
    if (pcStack_40 != (char *)0x0) {
      strcpy(pcVar5,pcStack_40);
      free(pcVar2);
    }
    puVar6 = ly_buf_used_location();
    *puVar6 = *puVar6 + 0xff;
    if (module == (lys_module *)0x0) {
      pcVar5 = _has_predicate + ((long)local_34 - (long)nodeid);
LAB_00115465:
      pcVar5 = strndup(nodeid,(size_t)pcVar5);
      code = LYE_PATH_INMOD;
      goto LAB_001152db;
    }
    _has_predicate = (char *)0x0;
    local_34 = 0;
    node = (lys_node_list *)0x0;
    pcStack_40 = nodeid;
  }
  else {
    node = (lys_node_list *)start;
    pcStack_40 = nodeid;
    if (start == (lys_node *)0x0) {
      __assert_fail("start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                    ,0x7e2,
                    "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                   );
    }
    do {
      if (node->nodetype != LYS_USES) goto LAB_0011504d;
      node = (lys_node_list *)lys_parent((lys_node *)node);
    } while (node != (lys_node_list *)0x0);
    node = (lys_node_list *)0x0;
LAB_0011504d:
    module = start->module;
  }
  list = (lys_node_list *)lys_getnext((lys_node *)0x0,(lys_node *)node,module,0xb);
  if (list != (lys_node_list *)0x0) {
    local_78 = pcStack_40 + uVar3;
    is_relative = 0;
    local_80 = module;
    do {
      pcVar2 = list->name;
      if (pcVar2 != (char *)0x0) {
        sVar12 = (size_t)mod_name._4_4_;
        iVar4 = strncmp(local_70,pcVar2,sVar12);
        if ((iVar4 == 0) && (pcVar2[sVar12] == '\0')) {
          plVar7 = local_80;
          if (_has_predicate != (char *)0x0) {
            if (0x3ff < local_34) {
              pLVar10 = ly_errno_location();
              *pLVar10 = LY_EINT;
              uVar11 = 0x81c;
              goto LAB_00115359;
            }
            puVar6 = ly_buf_used_location();
            if (*puVar6 == '\0') {
              name = (char *)0x0;
            }
            else if (*pcVar5 == '\0') {
              name = (char *)0x0;
            }
            else {
              name = strndup(pcVar5,0x3ff);
            }
            puVar6 = ly_buf_used_location();
            *puVar6 = *puVar6 + '\x01';
            sVar12 = (size_t)local_34;
            memmove(pcVar5,_has_predicate,sVar12);
            pcVar5[sVar12] = '\0';
            plVar7 = ly_ctx_get_module(ctx,pcVar5,(char *)0x0);
            pcVar2 = name;
            if (name != (char *)0x0) {
              strncpy(pcVar5,name,0x3ff);
              free(pcVar2);
            }
            puVar6 = ly_buf_used_location();
            *puVar6 = *puVar6 + 0xff;
            if (plVar7 == (lys_module *)0x0) {
              pcVar5 = _has_predicate + ((long)local_34 - (long)pcStack_40);
              nodeid = pcStack_40;
              goto LAB_00115465;
            }
          }
          plVar8 = lys_node_module((lys_node *)list);
          if (plVar7 == plVar8) {
            if (local_58 == 0) {
LAB_00115212:
              plVar9 = lys_parent((lys_node *)list);
              if ((plVar9 != (lys_node *)0x0) &&
                 (plVar9 = lys_parent((lys_node *)list), plVar9->nodetype == LYS_CHOICE)) {
                is_relative = is_relative ^ -(uint)(list->nodetype != LYS_CASE);
              }
              uVar3 = (uint)*local_78;
              if (uVar3 == 0) {
                if (is_relative == 0) {
                  return (lys_node *)list;
                }
                pcVar5 = strndup(pcStack_40,
                                 (size_t)(local_70 + ((long)mod_name._4_4_ - (long)pcStack_40)));
                ly_vlog(LYE_PATH_INNODE,LY_VLOG_STR,pcVar5);
                ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                        "Schema shorthand case path must include the virtual case statement.");
                goto LAB_001152ea;
              }
              if (is_relative == 0) {
                node = list;
                if ((list->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
                goto LAB_0011530d;
LAB_0011526e:
                local_80 = node->child->module;
              }
              else {
                if (node != (lys_node_list *)0x0) goto LAB_0011526e;
                node = (lys_node_list *)0x0;
                local_80 = module;
              }
              local_38 = parse_schema_nodeid(local_78,(char **)&has_predicate,&local_34,&local_70,
                                             (int *)((long)&mod_name + 4),&local_5c,&local_58);
              if (0 < (int)local_38) {
                local_78 = local_78 + local_38;
                list = (lys_node_list *)0x0;
                goto LAB_00115189;
              }
            }
            else {
              local_38 = 0;
              if ((list->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                if (list->nodetype == LYS_LIST) {
                  iVar4 = resolve_json_schema_list_predicate(local_78,list,(int *)&local_38);
                  if (iVar4 != 0) {
                    return (lys_node *)0x0;
                  }
LAB_0011520d:
                  local_78 = local_78 + (int)local_38;
                  goto LAB_00115212;
                }
                uVar3 = (uint)*local_78;
                goto LAB_0011530d;
              }
              local_38 = parse_schema_json_predicate
                                   (local_78,(char **)0x0,(int *)0x0,(char **)0x0,(int *)0x0,
                                    &local_58);
              if (0 < (int)local_38) goto LAB_0011520d;
            }
            cVar1 = local_78[-local_38];
            local_78 = local_78 + -local_38;
            goto LAB_00115301;
          }
        }
      }
LAB_00115189:
      list = (lys_node_list *)lys_getnext((lys_node *)list,(lys_node *)node,module,0xb);
    } while (list != (lys_node_list *)0x0);
  }
  pcVar5 = strndup(pcStack_40,(size_t)(local_70 + ((long)mod_name._4_4_ - (long)pcStack_40)));
  code = LYE_PATH_INNODE;
LAB_001152db:
  ly_vlog(code,LY_VLOG_STR,pcVar5);
LAB_001152ea:
  free(pcVar5);
  return (lys_node *)0x0;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, struct ly_ctx *ctx, const struct lys_node *start)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate, shorthand = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        } else if (mod_name_len > LY_BUF_SIZE - 1) {
            LOGINT;
            return NULL;
        }

        if (ly_buf_used && module_name[0]) {
            buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
        }
        ly_buf_used++;

        memmove(module_name, mod_name, mod_name_len);
        module_name[mod_name_len] = '\0';
        module = ly_ctx_get_module(ctx, module_name, NULL);

        if (buf_backup) {
            /* return previous internal buffer content */
            strcpy(module_name, buf_backup);
            free(buf_backup);
            buf_backup = NULL;
        }
        ly_buf_used--;

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* check for shorthand cases - then 'start_parent' does not change */
                if (lys_parent(sibling) && (lys_parent(sibling)->nodetype == LYS_CHOICE) && (sibling->nodetype != LYS_CASE)) {
                    shorthand = ~shorthand;
                }

                /* the result node? */
                if (!id[0]) {
                    if (shorthand) {
                        /* wrong path for shorthand */
                        str = strndup(nodeid, (name + nam_len) - nodeid);
                        LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
                        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Schema shorthand case path must include the virtual case statement.");
                        free(str);
                        return NULL;
                    }
                    return sibling;
                }

                if (!shorthand) {
                    /* move down the tree, if possible */
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    start_parent = sibling;
                }

                /* update prev mod */
                prev_mod = (start_parent ? start_parent->child->module : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT;
    return NULL;
}